

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFileComparator.cpp
# Opt level: O0

bool __thiscall
ApprovalTests::TextFileComparator::contentsAreEquivalent
          (TextFileComparator *this,string *receivedPath,string *approvedPath)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int_type iVar3;
  char *pcVar4;
  int r;
  int a;
  ifstream rstream;
  ifstream astream;
  undefined4 in_stack_fffffffffffffb78;
  int_type in_stack_fffffffffffffb7c;
  byte local_47a;
  undefined1 local_430 [520];
  undefined1 local_228 [551];
  byte local_1;
  
  pcVar4 = (char *)::std::__cxx11::string::c_str();
  _Var2 = ::std::operator|(_S_bin,_S_in);
  ::std::ifstream::ifstream(local_228,pcVar4,_Var2);
  pcVar4 = (char *)::std::__cxx11::string::c_str();
  _Var2 = ::std::operator|(_S_bin,_S_in);
  ::std::ifstream::ifstream(local_430,pcVar4,_Var2);
  while( true ) {
    bVar1 = ::std::ios::good();
    local_47a = 0;
    if ((bVar1 & 1) != 0) {
      local_47a = ::std::ios::good();
    }
    if ((local_47a & 1) == 0) break;
    iVar3 = getNextRelevantCharacter
                      ((ifstream *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    in_stack_fffffffffffffb7c =
         getNextRelevantCharacter
                   ((ifstream *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    if (iVar3 != in_stack_fffffffffffffb7c) {
      local_1 = 0;
LAB_00160dda:
      ::std::ifstream::~ifstream(local_430);
      ::std::ifstream::~ifstream(local_228);
      return (bool)(local_1 & 1);
    }
  }
  local_1 = 1;
  goto LAB_00160dda;
}

Assistant:

bool TextFileComparator::contentsAreEquivalent(std::string receivedPath,
                                                   std::string approvedPath) const
    {
        std::ifstream astream(approvedPath.c_str(), std::ios::binary | std::ifstream::in);
        std::ifstream rstream(receivedPath.c_str(), std::ios::binary | std::ifstream::in);

        while (astream.good() && rstream.good())
        {
            int a = getNextRelevantCharacter(astream);
            int r = getNextRelevantCharacter(rstream);

            if (a != r)
            {
                return false;
            }
        }
        return true;
    }